

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O2

int emulator_disassemble(Emulator *e,Address addr,char *buffer,size_t size)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  char bank [3];
  u8 data [3];
  char instr [120];
  
  data[0] = read_u8_raw(e,addr);
  data[1] = read_u8_raw(e,addr + 1);
  data[2] = read_u8_raw(e,addr + 2);
  iVar2 = disassemble_instr(data,instr,0x78);
  bank[2] = '\0';
  bank[0] = '?';
  bank[1] = '?';
  lVar3 = 0x3070;
  if ((addr < 0x4000) || (lVar3 = 0x3074, -1 < (short)addr)) {
    uVar1 = *(uint *)((long)(e->config).disable_sound + lVar3);
    bank[1] = "0123456789abcdef"[uVar1 >> 0xe & 0xf];
    bank[0] = "0123456789abcdef"[uVar1 >> 0x12 & 0xf];
  }
  snprintf(buffer,size,"[%s]%#06x: %s",bank,addr,instr);
  return iVar2 + (uint)(iVar2 == 0);
}

Assistant:

int emulator_disassemble(Emulator* e, Address addr, char* buffer, size_t size) {
  char instr[120];
  char hex[][3] = {"  ", "  ", "  "};

  u8 data[3] = {read_u8_raw(e, addr), read_u8_raw(e, addr + 1),
                read_u8_raw(e, addr + 2)};
  int num_bytes = disassemble_instr(data, instr, sizeof(instr));

  char bank[3] = "??";
  if (addr < 0x4000) {
    sprint_hex(bank, e->state.memory_map_state.rom_base[0] >> ROM_BANK_SHIFT);
  } else if (addr < 0x8000) {
    sprint_hex(bank, e->state.memory_map_state.rom_base[1] >> ROM_BANK_SHIFT);
  }

  snprintf(buffer, size, "[%s]%#06x: %s", bank, addr, instr);
  return num_bytes ? num_bytes : 1;
}